

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O2

int canvas_istable(_glist *x)

{
  _binbuf *p_Var1;
  t_symbol *ptVar2;
  int iVar3;
  t_atom *ptVar4;
  t_symbol *ptVar5;
  uint uVar6;
  
  p_Var1 = (x->gl_obj).te_binbuf;
  uVar6 = 0;
  if (p_Var1 != (_binbuf *)0x0) {
    ptVar4 = binbuf_getvec(p_Var1);
    p_Var1 = (x->gl_obj).te_binbuf;
    if (p_Var1 != (_binbuf *)0x0) {
      iVar3 = binbuf_getnatom(p_Var1);
      if ((iVar3 != 0) && (uVar6 = 0, ptVar4->a_type == A_SYMBOL)) {
        ptVar2 = (ptVar4->a_w).w_symbol;
        ptVar5 = gensym("table");
        uVar6 = (uint)(ptVar2 == ptVar5);
      }
    }
  }
  return uVar6;
}

Assistant:

int canvas_istable(const t_canvas *x)
{
    t_atom *argv = (x->gl_obj.te_binbuf? binbuf_getvec(x->gl_obj.te_binbuf):0);
    int argc = (x->gl_obj.te_binbuf? binbuf_getnatom(x->gl_obj.te_binbuf) : 0);
    int istable = (argc && argv[0].a_type == A_SYMBOL &&
        argv[0].a_w.w_symbol == gensym("table"));
    return (istable);
}